

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

char * ts_string_input_read(void *_self,uint32_t byte,TSPoint _,uint32_t *length)

{
  uint32_t uVar1;
  
  uVar1 = *(uint *)((long)_self + 8) - byte;
  if (byte <= *(uint *)((long)_self + 8) && uVar1 != 0) {
    *length = uVar1;
    return (char *)((ulong)byte + *_self);
  }
  *length = 0;
  return (char *)"";
}

Assistant:

static const char *ts_string_input_read(void *_self, uint32_t byte, TSPoint _, uint32_t *length) {
  TSStringInput *self = (TSStringInput *)_self;
  if (byte >= self->length) {
    *length = 0;
    return "";
  } else {
    *length = self->length - byte;
    return self->string + byte;
  }
}